

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O1

Eci * __thiscall SGP4::FindPositionSGP4(Eci *__return_storage_ptr__,SGP4 *this,double tsince)

{
  SatelliteException *this_00;
  double dVar1;
  double e;
  double dVar2;
  double omega;
  double dVar3;
  double dVar4;
  double __x;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  DateTime local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  dVar1 = (this->elements_).inclination_;
  __x = (this->common_consts_).xmdot * tsince + (this->elements_).mean_anomoly_;
  omega = (this->common_consts_).omgdot * tsince + (this->elements_).argument_perigee_;
  dVar4 = (this->elements_).ascending_node_;
  dVar3 = (this->common_consts_).xnodcf;
  dVar6 = (this->common_consts_).xnodot;
  dVar7 = tsince * tsince;
  dVar5 = 1.0 - (this->common_consts_).c1 * tsince;
  dVar2 = (this->elements_).bstar_ * (this->common_consts_).c4 * tsince;
  dVar8 = (this->common_consts_).t2cof * dVar7;
  if (this->use_simple_model_ == false) {
    local_40 = (this->nearspace_consts_).omgcof * tsince;
    local_30 = (this->common_consts_).eta;
    local_38 = (this->nearspace_consts_).xmcof;
    local_88 = dVar1;
    local_80 = dVar3;
    local_78 = dVar6;
    local_70 = dVar4;
    local_68 = dVar8;
    local_60 = dVar2;
    local_58 = omega;
    local_50 = tsince;
    local_48 = dVar7;
    local_28 = __x;
    local_20 = dVar5;
    dVar1 = cos(__x);
    dVar1 = pow(dVar1 * local_30 + 1.0,3.0);
    local_40 = (dVar1 - (this->nearspace_consts_).delmo) * local_38 + local_40;
    local_28 = local_28 + local_40;
    local_58 = local_58 - local_40;
    local_40 = local_48 * local_50;
    local_38 = local_40 * local_50;
    local_20 = ((local_20 - (this->nearspace_consts_).d2 * local_48) -
               (this->nearspace_consts_).d3 * local_40) - (this->nearspace_consts_).d4 * local_38;
    local_30 = (this->elements_).bstar_ * (this->nearspace_consts_).c5;
    dVar1 = sin(local_28);
    dVar2 = local_60 + (dVar1 - (this->nearspace_consts_).sinmo) * local_30;
    dVar8 = local_68 +
            local_40 * (this->nearspace_consts_).t3cof +
            ((this->nearspace_consts_).t5cof * local_50 + (this->nearspace_consts_).t4cof) *
            local_38;
    omega = local_58;
    dVar3 = local_80;
    dVar1 = local_88;
    tsince = local_50;
    __x = local_28;
    dVar5 = local_20;
    dVar6 = local_78;
    dVar4 = local_70;
    dVar7 = local_48;
  }
  dVar2 = (this->elements_).eccentricity_ - dVar2;
  if (-0.001 < dVar2) {
    e = 1e-06;
    if ((1e-06 <= dVar2) && (e = dVar2, 0.999999 < dVar2)) {
      e = 0.999999;
    }
    dVar4 = dVar3 * dVar7 + dVar6 * tsince + dVar4;
    local_90.m_encoded = (long)(tsince * 60000000.0) + (this->elements_).epoch_.m_encoded;
    CalculateFinalPositionVelocity
              (__return_storage_ptr__,&local_90,e,
               (this->elements_).recovered_semi_major_axis_ * dVar5 * dVar5,omega,
               (this->elements_).recovered_mean_motion_ * dVar8 + __x + omega + dVar4,dVar4,dVar1,
               (this->common_consts_).xlcof,(this->common_consts_).aycof,
               (this->common_consts_).x3thm1,(this->common_consts_).x1mth2,
               (this->common_consts_).x7thm1,(this->common_consts_).cosio,
               (this->common_consts_).sinio);
    return __return_storage_ptr__;
  }
  this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
  SatelliteException::SatelliteException(this_00,"Error: (e <= -0.001)");
  __cxa_throw(this_00,&SatelliteException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Eci SGP4::FindPositionSGP4(double tsince) const
{
    /*
     * the final values
     */
    double e;
    double a;
    double omega;
    double xl;
    double xnode;
    const double xinc = elements_.Inclination();

    /*
     * update for secular gravity and atmospheric drag
     */
    const double xmdf = elements_.MeanAnomoly()
        + common_consts_.xmdot * tsince;
    const double omgadf = elements_.ArgumentPerigee()
        + common_consts_.omgdot * tsince;
    const double xnoddf = elements_.AscendingNode()
        + common_consts_.xnodot * tsince;

    omega = omgadf;
    double xmp = xmdf;

    const double tsq = tsince * tsince;
    xnode = xnoddf + common_consts_.xnodcf * tsq;
    double tempa = 1.0 - common_consts_.c1 * tsince;
    double tempe = elements_.BStar() * common_consts_.c4 * tsince;
    double templ = common_consts_.t2cof * tsq;

    if (!use_simple_model_)
    {
        const double delomg = nearspace_consts_.omgcof * tsince;
        const double delm = nearspace_consts_.xmcof
            * (pow(1.0 + common_consts_.eta * cos(xmdf), 3.0)
                    - nearspace_consts_.delmo);
        const double temp = delomg + delm;

        xmp += temp;
        omega -= temp;

        const double tcube = tsq * tsince;
        const double tfour = tsince * tcube;

        tempa = tempa - nearspace_consts_.d2 * tsq - nearspace_consts_.d3
            * tcube - nearspace_consts_.d4 * tfour;
        tempe += elements_.BStar() * nearspace_consts_.c5
            * (sin(xmp) - nearspace_consts_.sinmo);
        templ += nearspace_consts_.t3cof * tcube + tfour
            * (nearspace_consts_.t4cof + tsince * nearspace_consts_.t5cof);
    }

    a = elements_.RecoveredSemiMajorAxis() * tempa * tempa;
    e = elements_.Eccentricity() - tempe;
    xl = xmp + omega + xnode + elements_.RecoveredMeanMotion() * templ;

    /*
     * fix tolerance for error recognition
     */
    if (e <= -0.001)
    {
        throw SatelliteException("Error: (e <= -0.001)");
    }
    else if (e < 1.0e-6)
    {
        e = 1.0e-6;
    }
    else if (e > (1.0 - 1.0e-6))
    {
        e = 1.0 - 1.0e-6;
    }

    /*
     * using calculated values, find position and velocity
     * we can pass in constants from Initialise() as these dont change
     */
    return CalculateFinalPositionVelocity(elements_.Epoch().AddMinutes(tsince),
                                          e,
                                          a,
                                          omega,
                                          xl,
                                          xnode,
                                          xinc,
                                          common_consts_.xlcof,
                                          common_consts_.aycof,
                                          common_consts_.x3thm1,
                                          common_consts_.x1mth2,
                                          common_consts_.x7thm1,
                                          common_consts_.cosio,
                                          common_consts_.sinio);
}